

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O3

void __thiscall PGSStreamReader::PGSStreamReader(PGSStreamReader *this)

{
  _Rb_tree_header *p_Var1;
  TextToPGSConverter *this_00;
  
  (this->super_AbstractStreamReader).m_secondary = false;
  (this->super_AbstractStreamReader).m_flags = 0;
  (this->super_AbstractStreamReader).m_containerType = ctNone;
  (this->super_AbstractStreamReader).m_timeOffset = 0;
  (this->super_AbstractStreamReader).m_buffer = (uint8_t *)0x0;
  (this->super_AbstractStreamReader).m_curPos = (uint8_t *)0x0;
  *(undefined8 *)((long)&(this->super_AbstractStreamReader).m_curPos + 4) = 0;
  *(undefined8 *)((long)&(this->super_AbstractStreamReader).m_bufEnd + 4) = 0;
  (this->super_AbstractStreamReader).m_pipParams.scaleIndex = 1;
  (this->super_AbstractStreamReader).m_pipParams.corner = 0;
  (this->super_AbstractStreamReader).m_pipParams.hOffset = 0;
  (this->super_AbstractStreamReader).m_pipParams.vOffset = 0;
  (this->super_AbstractStreamReader).m_pipParams.lumma = 3;
  (this->super_AbstractStreamReader).super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader =
       (_func_int **)&PTR__PGSStreamReader_0023f208;
  (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_avFragmentEnd = (uint8_t *)0x0;
  (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->object_width = 0;
  this->object_height = 0;
  p_Var1 = &(this->m_palette)._M_t._M_impl.super__Rb_tree_header;
  (this->m_palette)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_palette)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_palette)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_palette)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_palette)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_firstRenderedPacket = true;
  (this->m_renderedBlocks).
  super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_renderedBlocks).
  super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_renderedBlocks).
  super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->composition_object_horizontal_position)._M_t._M_impl.super__Rb_tree_header;
  (this->composition_object_horizontal_position)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->composition_object_horizontal_position)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->composition_object_horizontal_position)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->composition_object_horizontal_position)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->composition_object_horizontal_position)._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0;
  p_Var1 = &(this->composition_object_vertical_position)._M_t._M_impl.super__Rb_tree_header;
  (this->composition_object_vertical_position)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->composition_object_vertical_position)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->composition_object_vertical_position)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->composition_object_vertical_position)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  this->m_objectWindowHeight = 0;
  this->m_objectWindowTop = 0;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  this->m_state = stParsePES;
  (this->super_AbstractStreamReader).m_buffer = (uint8_t *)0x0;
  (this->super_AbstractStreamReader).m_curPos = (uint8_t *)0x0;
  (this->composition_object_vertical_position)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_palleteID = 0;
  this->m_paletteVersion = 0;
  this->composition_state = csEpochStart;
  this->m_processedSize = 0;
  (this->super_AbstractStreamReader).m_demuxMode = false;
  this->m_afterPesByte = 0;
  *(undefined4 *)&this->m_lastPTS = 0xffffffff;
  *(undefined4 *)((long)&this->m_lastPTS + 4) = 0xffffffff;
  *(undefined4 *)&this->m_maxPTS = 0xffffffff;
  *(undefined4 *)((long)&this->m_maxPTS + 4) = 0xffffffff;
  this->m_lastDTS = -1;
  this->m_video_width = 0;
  this->m_video_height = 0;
  this->m_frame_rate = 0.0;
  this->m_newFps = 0.0;
  this->m_scale = 1.0;
  this->m_isNewFrame = false;
  this->m_needRescale = false;
  this->m_scaled_width = 0;
  this->m_scaled_height = 0;
  this->m_scaledRgbBuffer = (uint8_t *)0x0;
  this->m_imgBuffer = (uint8_t *)0x0;
  this->m_rgbBuffer = (uint8_t *)0x0;
  this_00 = (TextToPGSConverter *)operator_new(0xa0);
  text_subtitles::TextToPGSConverter::TextToPGSConverter(this_00,false);
  this->m_render = this_00;
  this->m_renderedData = (uint8_t *)0x0;
  this->m_fontBorder = 0;
  this->m_offsetId = 0xff;
  this->m_forced_on_flag = false;
  this->isSSPG = false;
  this->leftEyeSubStreamIdx = -1;
  this->rightEyeSubStreamIdx = -1;
  this->ssPGOffset = 0xff;
  return;
}

Assistant:

PGSStreamReader::PGSStreamReader()
    : m_avFragmentEnd(nullptr),
      object_width(0),
      object_height(0),
      m_firstRenderedPacket(true),
      m_palleteID(0),
      m_paletteVersion(0),
      m_objectWindowHeight(0),
      m_objectWindowTop(0)
{
    m_curPos = m_buffer = nullptr;
    m_tmpBufferLen = 0;
    m_state = State::stParsePES;
    composition_state = CompositionState::csEpochStart;
    m_processedSize = 0;
    m_demuxMode = false;
    m_afterPesByte = 0;
    // m_supWritedPts = m_supWritedDts = -1;
    m_maxPTS = m_lastDTS = m_lastPTS = -1;
    m_video_width = 0;
    m_video_height = 0;
    m_frame_rate = 0;
    m_newFps = 0;
    m_scale = 1.0;
    m_isNewFrame = false;
    m_needRescale = false;
    m_imgBuffer = nullptr;
    m_rgbBuffer = nullptr;
    m_scaledRgbBuffer = nullptr;
    m_scaled_width = 0;
    m_scaled_height = 0;
    m_render = new TextToPGSConverter(false);
    m_renderedData = nullptr;
    m_fontBorder = 0;
    m_offsetId = 0xff;
    m_forced_on_flag = false;

    // SS PG data
    isSSPG = false;
    leftEyeSubStreamIdx = -1;
    rightEyeSubStreamIdx = -1;
    ssPGOffset = 0xff;
}